

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

bool __thiscall pstore::indirect_string::operator<(indirect_string *this,indirect_string *rhs)

{
  bool bVar1;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_88;
  raw_sstring_view local_80 [2];
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_60;
  raw_sstring_view local_58;
  undefined1 local_48 [8];
  shared_sstring_view rhs_owner;
  shared_sstring_view lhs_owner;
  indirect_string *rhs_local;
  indirect_string *this_local;
  
  if (this->db_ == rhs->db_) {
    sstring_view<std::shared_ptr<const_char>_>::sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)&rhs_owner.size_);
    sstring_view<std::shared_ptr<const_char>_>::sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)local_48);
    gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
              (&local_60,(sstring_view<std::shared_ptr<const_char>_> *)&rhs_owner.size_);
    local_58 = as_string_view(this,local_60);
    gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
              (&local_88,(sstring_view<std::shared_ptr<const_char>_> *)local_48);
    local_80[0] = as_string_view(rhs,local_88);
    bVar1 = pstore::operator<(&local_58,local_80);
    sstring_view<std::shared_ptr<const_char>_>::~sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)local_48);
    sstring_view<std::shared_ptr<const_char>_>::~sstring_view
              ((sstring_view<std::shared_ptr<const_char>_> *)&rhs_owner.size_);
    return bVar1;
  }
  assert_failed("&db_ == &rhs.db_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                ,0x38);
}

Assistant:

bool indirect_string::operator< (indirect_string const & rhs) const {
        PSTORE_ASSERT (&db_ == &rhs.db_);
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) < rhs.as_string_view (&rhs_owner);
    }